

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::UnionInPlace
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  CharSetInner *this_00;
  undefined4 extraout_var;
  uint i;
  uint index;
  undefined **ppuVar6;
  
  if ((other->rep).compact.countPlusOne - 1 < 5) {
    for (index = 0; uVar3 = GetCompactLength(other), index < uVar3; index = index + 1) {
      uVar3 = GetCompactCharU(other,index);
      Set(this,allocator,(Char)uVar3);
    }
    return;
  }
  if ((((this->rep).compact.countPlusOne - 1 < 5) &&
      (SwitchRepresentations(this,allocator), (this->rep).compact.countPlusOne - 1 < 5)) ||
     ((other->rep).compact.countPlusOne - 1 < 5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x48e,"(!IsCompact() && !other.IsCompact())",
                       "!IsCompact() && !other.IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  CharBitvec::UnionInPlace(&(this->rep).full.direct,&(other->rep).full.direct);
  ppuVar6 = (undefined **)(other->rep).compact.countPlusOne;
  if (ppuVar6 != (undefined **)0x0) {
    this_00 = (CharSetInner *)(this->rep).full.root;
    if (ppuVar6 == &CharSetFull::Instance) {
      ppuVar6 = &CharSetFull::Instance;
      if (this_00 != (CharSetInner *)0x0) {
        (**(this_00->super_CharSetNode)._vptr_CharSetNode)(this_00,allocator);
      }
    }
    else {
      if (this_00 == (CharSetInner *)0x0) {
        this_00 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x35916e);
        CharSetInner::CharSetInner(this_00);
        (this->rep).full.root = (CharSetNode *)this_00;
        ppuVar6 = (undefined **)(other->rep).compact.countPlusOne;
      }
      iVar4 = (*(this_00->super_CharSetNode)._vptr_CharSetNode[4])(this_00,allocator,2,ppuVar6);
      ppuVar6 = (undefined **)CONCAT44(extraout_var,iVar4);
    }
    (this->rep).compact.countPlusOne = (size_t)ppuVar6;
  }
  return;
}

Assistant:

void CharSet<char16>::UnionInPlace(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                Set(allocator, other.GetCompactChar(i));
            }
            return;
        }

        if (IsCompact())
            SwitchRepresentations(allocator);

        Assert(!IsCompact() && !other.IsCompact());

        rep.full.direct.UnionInPlace(other.rep.full.direct);

        if (other.rep.full.root != nullptr)
        {
            if (other.rep.full.root == CharSetFull::TheFullNode)
            {
                if (rep.full.root != nullptr)
                    rep.full.root->FreeSelf(allocator);
                rep.full.root = CharSetFull::TheFullNode;
            }
            else
            {
                if (rep.full.root == nullptr)
                    rep.full.root = Anew(allocator, CharSetInner);
                rep.full.root = rep.full.root->UnionInPlace(allocator, CharSetNode::levels - 1, other.rep.full.root);
            }
        }
    }